

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChLinePath.cpp
# Opt level: O2

void __thiscall
chrono::geometry::ChLinePath::AddSubLine
          (ChLinePath *this,shared_ptr<chrono::geometry::ChLine> *mline,double duration)

{
  double local_18;
  
  std::
  vector<std::shared_ptr<chrono::geometry::ChLine>,_std::allocator<std::shared_ptr<chrono::geometry::ChLine>_>_>
  ::push_back(&this->lines,mline);
  local_18 = 0.0;
  std::vector<double,_std::allocator<double>_>::emplace_back<double>(&this->durations,&local_18);
  local_18 = 0.0;
  std::vector<double,_std::allocator<double>_>::emplace_back<double>(&this->end_times,&local_18);
  SetSubLineDurationN(this,((long)(this->lines).
                                  super__Vector_base<std::shared_ptr<chrono::geometry::ChLine>,_std::allocator<std::shared_ptr<chrono::geometry::ChLine>_>_>
                                  ._M_impl.super__Vector_impl_data._M_finish -
                            (long)(this->lines).
                                  super__Vector_base<std::shared_ptr<chrono::geometry::ChLine>,_std::allocator<std::shared_ptr<chrono::geometry::ChLine>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start >> 4) - 1,duration);
  return;
}

Assistant:

void ChLinePath::AddSubLine(std::shared_ptr<ChLine> mline, double duration) {
    lines.push_back(mline);
    durations.push_back(0);
    end_times.push_back(0);
    SetSubLineDurationN(lines.size() - 1, duration);
}